

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartResumePdu.cpp
# Opt level: O2

int __thiscall DIS::StartResumePdu::getMarshalledSize(StartResumePdu *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = SimulationManagementFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementFamilyPdu);
  iVar2 = ClockTime::getMarshalledSize(&this->_realWorldTime);
  iVar3 = ClockTime::getMarshalledSize(&this->_simulationTime);
  return iVar3 + iVar2 + iVar1 + 4;
}

Assistant:

int StartResumePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _realWorldTime.getMarshalledSize();  // _realWorldTime
   marshalSize = marshalSize + _simulationTime.getMarshalledSize();  // _simulationTime
   marshalSize = marshalSize + 4;  // _requestID
    return marshalSize;
}